

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O3

int PystringSet_Convert(PyObject *py_strings,xmlChar ***result)

{
  ulong uVar1;
  xmlChar **__s;
  PyTypeObject **ppPVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  undefined8 uVar8;
  long lVar9;
  
  uVar1 = py_strings->ob_type->tp_flags;
  if ((uVar1 & 0x6000000) == 0) {
    if (py_strings != (PyObject *)&_Py_NoneStruct) {
LAB_0013f2ee:
      pcVar7 = "must be a tuple or list of strings.";
      uVar8 = _PyExc_TypeError;
      goto LAB_0013f2ff;
    }
    *result = (xmlChar **)0x0;
  }
  else {
    uVar4 = (uint)py_strings[1].ob_refcnt;
    __s = (xmlChar **)(*_xmlMalloc)((long)(int)uVar4 << 3);
    if (__s == (xmlChar **)0x0) {
      pcVar7 = "";
      uVar8 = _PyExc_MemoryError;
LAB_0013f2ff:
      PyErr_SetString(uVar8,pcVar7);
      return -1;
    }
    memset(__s,0,(long)(int)uVar4 << 3);
    if (0 < (int)uVar4) {
      uVar5 = (ulong)(uVar4 & 0x7fffffff);
      lVar6 = 0;
      lVar9 = 0;
      do {
        uVar4 = (uint)py_strings->ob_type->tp_flags;
        if (((uint)uVar1 >> 0x1a & 1) == 0) {
          if ((uVar4 >> 0x19 & 1) == 0) {
            __assert_fail("PyList_Check(py_strings)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/python/libxml.c"
                          ,0xe07,"int PystringSet_Convert(PyObject *, xmlChar ***)");
          }
          ppPVar2 = (PyTypeObject **)
                    ((long)&((py_strings[1].ob_type)->ob_base).ob_base.ob_refcnt + lVar6);
        }
        else {
          if ((uVar4 >> 0x1a & 1) == 0) {
            __assert_fail("PyTuple_Check(py_strings)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/python/libxml.c"
                          ,0xe06,"int PystringSet_Convert(PyObject *, xmlChar ***)");
          }
          ppPVar2 = &py_strings[1].ob_type + lVar9;
        }
        lVar3 = PyBytes_AsString(*ppPVar2);
        if (lVar3 == 0) {
          (*_xmlFree)(__s);
          goto LAB_0013f2ee;
        }
        lVar9 = lVar9 + 1;
        *(long *)((long)__s + lVar6) = lVar3;
        lVar6 = lVar6 + 8;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
    *result = __s;
  }
  return 0;
}

Assistant:

static int
PystringSet_Convert(PyObject *py_strings, xmlChar *** result)
{
    /* NOTE: the array should be freed, but the strings are shared
       with the python strings and so must not be freed. */

    xmlChar ** strings;
    int is_tuple = 0;
    int count;
    int init_index = 0;

    if (PyTuple_Check(py_strings))
        is_tuple = 1;
    else if (PyList_Check(py_strings))
        is_tuple = 0;
    else if (py_strings == Py_None) {
        *result = NULL;
        return 0;
    }
    else {
        PyErr_SetString(PyExc_TypeError,
                        "must be a tuple or list of strings.");
        return -1;
    }

    count = (is_tuple
             ? PyTuple_GET_SIZE(py_strings)
             : PyList_GET_SIZE(py_strings));

    strings = (xmlChar **) xmlMalloc(sizeof(xmlChar *) * count);

    if (strings == NULL) {
        PyErr_SetString(PyExc_MemoryError, "");
        return -1;
    }

    memset(strings, 0 , sizeof(xmlChar *) * count);

    {
        int idx;
        for (idx=0; idx < count; ++idx) {
            char* s = PyBytes_AsString
                (is_tuple
                 ? PyTuple_GET_ITEM(py_strings, idx)
                 : PyList_GET_ITEM(py_strings, idx));
            if (s)
                strings[init_index++] = (xmlChar *)s;
            else {
                xmlFree(strings);
                PyErr_SetString(PyExc_TypeError,
                                "must be a tuple or list of strings.");
                return -1;
            }
        }
    }

    *result = strings;
    return 0;
}